

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

string * __thiscall
testing::internal::
DefaultParamName<(anonymous_namespace)::DrPredFunc<void(*)(unsigned_short*,long,int,int,unsigned_short_const*,unsigned_short_const*,int,int,int,int,int)>>
          (string *__return_storage_ptr__,internal *this,
          TestParamInfo<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
          *info)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  Message::Message((Message *)&local_20);
  Message::operator<<((Message *)&local_20,(unsigned_long *)(this + 0x18));
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&local_20);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  Message name_stream;
  name_stream << info.index;
  return name_stream.GetString();
}